

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_Hash.c
# Opt level: O3

void EverCrypt_Hash_Incremental_hash_256(uint8_t *output,uint8_t *input,uint32_t input_len)

{
  uint32_t n;
  uint32_t *os;
  uint len;
  uint32_t local_48 [8];
  
  local_48[0] = 0x6a09e667;
  local_48[1] = 0xbb67ae85;
  local_48[2] = 0x3c6ef372;
  local_48[3] = 0xa54ff53a;
  local_48[4] = 0x510e527f;
  local_48[5] = 0x9b05688c;
  local_48[6] = 0x1f83d9ab;
  local_48[7] = 0x5be0cd19;
  n = (input_len >> 6) - (uint)(0x3f < input_len && (input_len & 0x3f) == 0);
  len = input_len + n * -0x40;
  EverCrypt_Hash_update_multi_256(local_48,input,n);
  Hacl_Hash_SHA2_sha256_update_last((ulong)(n * 0x40) + (ulong)len,len,input + n * 0x40,local_48);
  Hacl_Hash_SHA2_sha256_finish(local_48,output);
  return;
}

Assistant:

void EverCrypt_Hash_Incremental_hash_256(uint8_t *output, uint8_t *input, uint32_t input_len)
{
  uint32_t st[8U] = { 0U };
  KRML_MAYBE_FOR8(i,
    0U,
    8U,
    1U,
    uint32_t *os = st;
    uint32_t x = Hacl_Hash_SHA2_h256[i];
    os[i] = x;);
  uint32_t *s = st;
  uint32_t blocks_n0 = input_len / 64U;
  uint32_t blocks_n1;
  if (input_len % 64U == 0U && blocks_n0 > 0U)
  {
    blocks_n1 = blocks_n0 - 1U;
  }
  else
  {
    blocks_n1 = blocks_n0;
  }
  uint32_t blocks_len0 = blocks_n1 * 64U;
  uint8_t *blocks0 = input;
  uint32_t rest_len0 = input_len - blocks_len0;
  uint8_t *rest0 = input + blocks_len0;
  uint32_t blocks_n = blocks_n1;
  uint32_t blocks_len = blocks_len0;
  uint8_t *blocks = blocks0;
  uint32_t rest_len = rest_len0;
  uint8_t *rest = rest0;
  EverCrypt_Hash_update_multi_256(s, blocks, blocks_n);
  Hacl_Hash_SHA2_sha256_update_last((uint64_t)blocks_len + (uint64_t)rest_len,
    rest_len,
    rest,
    s);
  Hacl_Hash_SHA2_sha256_finish(s, output);
}